

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxingBase.h
# Opt level: O1

string * __thiscall
BoxingBaseWithRW<unsigned_long,STDStreamsReader<unsigned_long>,STDStreamsWriter<unsigned_long>>::
ToString_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  STDStreamsWriter<unsigned_long> writer;
  STDStreamsWriter<unsigned_long> local_19;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  STDStreamsWriter<unsigned_long>::Write(&local_19,(unsigned_long *)this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string BoxingBaseWithRW<U,Reader,Writer>::ToString() const
{
	Writer writer;
	std::string aString;

	writer.Write(this->boxedValue,aString);

	return aString;
}